

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

void __thiscall CLI::App::_process_ini(App *this)

{
  bool bVar1;
  ulong uVar2;
  element_type *this_00;
  FileError *anon_var_0;
  undefined1 local_28 [8];
  vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> values;
  App *this_local;
  
  if (this->config_ptr_ != (Option *)0x0) {
    values.super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)this;
    bVar1 = Option::operator_cast_to_bool(this->config_ptr_);
    if (bVar1) {
      Option::run_callback(this->config_ptr_);
      this->config_required_ = true;
    }
    uVar2 = ::std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      this_00 = std::__shared_ptr_access<CLI::Config,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<CLI::Config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&this->config_formatter_);
      Config::from_file((vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *)local_28,
                        this_00,&this->config_name_);
      _parse_config(this,(vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *)local_28);
      std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::~vector
                ((vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *)local_28);
    }
  }
  return;
}

Assistant:

void _process_ini() {
        // Process an INI file
        if(config_ptr_ != nullptr) {
            if(*config_ptr_) {
                config_ptr_->run_callback();
                config_required_ = true;
            }
            if(!config_name_.empty()) {
                try {
                    std::vector<ConfigItem> values = config_formatter_->from_file(config_name_);
                    _parse_config(values);
                } catch(const FileError &) {
                    if(config_required_)
                        throw;
                }
            }
        }
    }